

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O0

void __thiscall gui::Signal<gui::Widget_*>::emit(Signal<gui::Widget_*> *this,Widget *funcArgs)

{
  bool bVar1;
  Tag TVar2;
  Widget *in_RDI;
  pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_> *c;
  const_iterator __end0;
  const_iterator __begin0;
  map<unsigned_int,_gui::Callback<gui::Widget_*>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
  *__range2;
  reference in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  _Rb_tree_header *local_18;
  
  if ((undefined1  [48])
      ((undefined1  [48])((_Rep_type *)&in_RDI->super_Drawable)->_M_impl & (undefined1  [48])0x1) !=
      (undefined1  [48])0x0) {
    local_18 = (_Rb_tree_header *)&in_RDI->super_enable_shared_from_this<gui::Widget>;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_gui::Callback<gui::Widget_*>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
         ::begin((map<unsigned_int,_gui::Callback<gui::Widget_*>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
                  *)in_RDI);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_gui::Callback<gui::Widget_*>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
         ::end((map<unsigned_int,_gui::Callback<gui::Widget_*>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
                *)in_RDI);
    while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
      in_stack_ffffffffffffffd0 =
           std::
           _Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>::
           operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>
                      *)in_stack_ffffffffffffffd0);
      TVar2 = Callback<gui::Widget_*>::getTag(&in_stack_ffffffffffffffd0->second);
      if (TVar2 == withArgs) {
        Callback<gui::Widget*>::value<(gui::Callback<gui::Widget*>::Tag)0,void>
                  ((Callback<gui::Widget*> *)&in_stack_ffffffffffffffd0->second);
        std::function<void_(gui::Widget_*)>::operator()
                  ((function<void_(gui::Widget_*)> *)in_stack_ffffffffffffffd0,in_RDI);
      }
      else {
        Callback<gui::Widget*>::value<(gui::Callback<gui::Widget*>::Tag)1,void>
                  ((Callback<gui::Widget*> *)&in_stack_ffffffffffffffd0->second);
        std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffffd0);
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>::
      operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>
                  *)in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void emit(Targs... funcArgs) const {
        if (!enabled_) {
            return;
        }
        using Tag = typename Callback<Targs...>::Tag;
        for (const auto& c : callbacks_) {
            if (c.second.getTag() == Tag::withArgs) {
                c.second.template value<Tag::withArgs>()(funcArgs...);
            } else {
                c.second.template value<Tag::noArgs>()();
            }
        }
    }